

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationruleparser.cpp
# Opt level: O2

int32_t __thiscall
icu_63::CollationRuleParser::parseRelationOperator(CollationRuleParser *this,UErrorCode *errorCode)

{
  short sVar1;
  char16_t cVar2;
  int32_t offset;
  int32_t iVar3;
  int iVar4;
  int offset_00;
  UnicodeString *pUVar5;
  uint uVar6;
  
  uVar6 = 0xffffffff;
  if (*errorCode < U_ILLEGAL_ARGUMENT_ERROR) {
    offset = skipWhiteSpace(this,this->ruleIndex);
    this->ruleIndex = offset;
    pUVar5 = this->rules;
    sVar1 = (pUVar5->fUnion).fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar3 = (pUVar5->fUnion).fFields.fLength;
    }
    else {
      iVar3 = (int)sVar1 >> 5;
    }
    if (offset < iVar3) {
      offset_00 = offset + 1;
      cVar2 = UnicodeString::doCharAt(pUVar5,offset);
      if (cVar2 == L',') {
        uVar6 = 2;
      }
      else if (cVar2 == L';') {
        uVar6 = 1;
      }
      else if (cVar2 == L'=') {
        pUVar5 = this->rules;
        sVar1 = (pUVar5->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar3 = (pUVar5->fUnion).fFields.fLength;
        }
        else {
          iVar3 = (int)sVar1 >> 5;
        }
        if (offset_00 < iVar3) {
          cVar2 = UnicodeString::doCharAt(pUVar5,offset_00);
          iVar4 = offset + 2;
          if (cVar2 != L'*') {
            iVar4 = offset_00;
          }
          offset_00 = iVar4;
          uVar6 = (uint)(cVar2 == L'*') << 4 | 0xf;
        }
        else {
          uVar6 = 0xf;
        }
      }
      else {
        if (cVar2 != L'<') {
          return -1;
        }
        pUVar5 = this->rules;
        sVar1 = (pUVar5->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar3 = (pUVar5->fUnion).fFields.fLength;
        }
        else {
          iVar3 = (int)sVar1 >> 5;
        }
        uVar6 = 0;
        if (offset_00 < iVar3) {
          cVar2 = UnicodeString::doCharAt(pUVar5,offset_00);
          pUVar5 = this->rules;
          if (cVar2 == L'<') {
            offset_00 = offset + 2;
            sVar1 = (pUVar5->fUnion).fStackFields.fLengthAndFlags;
            if (sVar1 < 0) {
              iVar3 = (pUVar5->fUnion).fFields.fLength;
            }
            else {
              iVar3 = (int)sVar1 >> 5;
            }
            uVar6 = 1;
            if (offset_00 < iVar3) {
              cVar2 = UnicodeString::doCharAt(pUVar5,offset_00);
              pUVar5 = this->rules;
              if (cVar2 == L'<') {
                offset_00 = offset + 3;
                sVar1 = (pUVar5->fUnion).fStackFields.fLengthAndFlags;
                if (sVar1 < 0) {
                  iVar3 = (pUVar5->fUnion).fFields.fLength;
                }
                else {
                  iVar3 = (int)sVar1 >> 5;
                }
                if (offset_00 < iVar3) {
                  cVar2 = UnicodeString::doCharAt(pUVar5,offset_00);
                  iVar4 = offset + 4;
                  if (cVar2 != L'<') {
                    iVar4 = offset_00;
                  }
                  uVar6 = cVar2 == L'<' | 2;
                  pUVar5 = this->rules;
                  offset_00 = iVar4;
                }
                else {
                  uVar6 = 2;
                }
              }
            }
          }
        }
        sVar1 = (pUVar5->fUnion).fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar4 = (pUVar5->fUnion).fFields.fLength;
        }
        else {
          iVar4 = (int)sVar1 >> 5;
        }
        if ((offset_00 < iVar4) &&
           (cVar2 = UnicodeString::doCharAt(pUVar5,offset_00), cVar2 == L'*')) {
          offset_00 = offset_00 + 1;
          uVar6 = uVar6 | 0x10;
        }
      }
      uVar6 = (offset_00 - this->ruleIndex) * 0x100 | uVar6;
    }
  }
  return uVar6;
}

Assistant:

int32_t
CollationRuleParser::parseRelationOperator(UErrorCode &errorCode) {
    if(U_FAILURE(errorCode)) { return UCOL_DEFAULT; }
    ruleIndex = skipWhiteSpace(ruleIndex);
    if(ruleIndex >= rules->length()) { return UCOL_DEFAULT; }
    int32_t strength;
    int32_t i = ruleIndex;
    UChar c = rules->charAt(i++);
    switch(c) {
    case 0x3c:  // '<'
        if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<
            ++i;
            if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<<
                ++i;
                if(i < rules->length() && rules->charAt(i) == 0x3c) {  // <<<<
                    ++i;
                    strength = UCOL_QUATERNARY;
                } else {
                    strength = UCOL_TERTIARY;
                }
            } else {
                strength = UCOL_SECONDARY;
            }
        } else {
            strength = UCOL_PRIMARY;
        }
        if(i < rules->length() && rules->charAt(i) == 0x2a) {  // '*'
            ++i;
            strength |= STARRED_FLAG;
        }
        break;
    case 0x3b:  // ';' same as <<
        strength = UCOL_SECONDARY;
        break;
    case 0x2c:  // ',' same as <<<
        strength = UCOL_TERTIARY;
        break;
    case 0x3d:  // '='
        strength = UCOL_IDENTICAL;
        if(i < rules->length() && rules->charAt(i) == 0x2a) {  // '*'
            ++i;
            strength |= STARRED_FLAG;
        }
        break;
    default:
        return UCOL_DEFAULT;
    }
    return ((i - ruleIndex) << OFFSET_SHIFT) | strength;
}